

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utrie.cpp
# Opt level: O0

int32_t utrie_allocDataBlock(UNewTrie *trie)

{
  int32_t newTop;
  int32_t newBlock;
  UNewTrie *trie_local;
  
  trie_local._4_4_ = trie->dataLength;
  if (trie->dataCapacity < trie_local._4_4_ + 0x20) {
    trie_local._4_4_ = -1;
  }
  else {
    trie->dataLength = trie_local._4_4_ + 0x20;
  }
  return trie_local._4_4_;
}

Assistant:

static int32_t
utrie_allocDataBlock(UNewTrie *trie) {
    int32_t newBlock, newTop;

    newBlock=trie->dataLength;
    newTop=newBlock+UTRIE_DATA_BLOCK_LENGTH;
    if(newTop>trie->dataCapacity) {
        /* out of memory in the data array */
        return -1;
    }
    trie->dataLength=newTop;
    return newBlock;
}